

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_container_intersection_inplace(array_container_t *src_1,array_container_t *src_2)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  size_t lenA;
  size_t lenB;
  size_t size_l;
  uint16_t *large;
  uint16_t *small;
  uint16_t *buffer;
  
  iVar1 = src_1->cardinality;
  lenA = (size_t)iVar1;
  iVar2 = src_2->cardinality;
  lenB = (size_t)iVar2;
  if (iVar1 * 0x40 < iVar2) {
    small = src_1->array;
    large = src_2->array;
    size_l = lenB;
    lenB = lenA;
    buffer = small;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      iVar3 = intersect_uint16(src_1->array,lenA,src_2->array,lenB,src_1->array);
      goto LAB_00103a55;
    }
    small = src_2->array;
    large = src_1->array;
    size_l = lenA;
    buffer = large;
  }
  iVar3 = intersect_skewed_uint16(small,lenB,large,size_l,buffer);
LAB_00103a55:
  src_1->cardinality = iVar3;
  return;
}

Assistant:

void array_container_intersection_inplace(array_container_t *src_1,
                                          const array_container_t *src_2) {
    // todo: can any of this be vectorized?
    int32_t card_1 = src_1->cardinality, card_2 = src_2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        src_1->cardinality = intersect_skewed_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    } else if (card_2 * threshold < card_1) {
        src_1->cardinality = intersect_skewed_uint16(
            src_2->array, card_2, src_1->array, card_1, src_1->array);
    } else {
        src_1->cardinality = intersect_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    }
}